

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::SectionStats::~SectionStats(SectionStats *this)

{
  this->_vptr_SectionStats = (_func_int **)&PTR__SectionStats_0018dfe0;
  SectionInfo::~SectionInfo(&this->sectionInfo);
  return;
}

Assistant:

SectionStats::~SectionStats() = default;